

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::extMul<2ul,int,long,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Type *other;
  bool bVar1;
  Literal *pLVar2;
  long lVar3;
  Literal *val;
  bool bVar4;
  undefined1 local_138 [8];
  LaneArray<2UL_*_2> lhs;
  LaneArray<2UL_*_2> rhs;
  LaneArray<2UL> result;
  
  getLanes<int,4>((LaneArray<4> *)local_138,this,a);
  getLanes<int,4>((LaneArray<4> *)&lhs._M_elems[3].type,(wasm *)a,val);
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  rhs._M_elems[3].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  lVar3 = 2;
  other = &result._M_elems[1].type;
  bVar4 = true;
  pLVar2 = rhs._M_elems + 3;
  while ((lhs._M_elems[lVar3].field_0.func.super_IString.str._M_str == (char *)0x2 &&
         (rhs._M_elems[lVar3].field_0.func.super_IString.str._M_str == (char *)0x2))) {
    result._M_elems[1].type.id =
         (long)(int)lhs._M_elems[lVar3 + 3].type.id * (long)(int)lhs._M_elems[lVar3 + -1].type.id;
    Literal::~Literal((Literal *)&pLVar2->type);
    Literal::Literal((Literal *)&pLVar2->type,(Literal *)other);
    Literal::~Literal((Literal *)other);
    lVar3 = 3;
    bVar1 = !bVar4;
    bVar4 = false;
    pLVar2 = result._M_elems;
    if (bVar1) {
      Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)&rhs._M_elems[3].type);
      lVar3 = 0x18;
      do {
        Literal::~Literal((Literal *)((long)&rhs._M_elems[3].type.id + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      lVar3 = 0x48;
      do {
        Literal::~Literal((Literal *)((long)&lhs._M_elems[3].type.id + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      lVar3 = 0x48;
      do {
        Literal::~Literal((Literal *)(local_138 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      return __return_storage_ptr__;
    }
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                ,0x118,"int32_t wasm::Literal::geti32() const");
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}